

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cpp
# Opt level: O3

block * lsvm::bytecode::new_bytecode_block(uint32_t v_copy,bytecode *bytecode)

{
  block *pbVar1;
  
  pbVar1 = (block *)memory::allocate((ulong)v_copy * 0x10 + 0x20);
  pbVar1->v_args = bytecode->v_args;
  pbVar1->v_copy = v_copy;
  pbVar1->v_temp = bytecode->v_temp;
  pbVar1->op = bytecode->op;
  return pbVar1;
}

Assistant:

block* new_bytecode_block(uint32_t v_copy, bytecode* bytecode){
    block* b = (block*)lsvm::memory::allocate(
            sizeof(block)+(v_copy*sizeof(variable))
            );
    b->v_args = bytecode->v_args;
    b->v_copy = v_copy;
    b->v_temp = bytecode->v_temp;
    b->op = bytecode->op;
    return b;
}